

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O1

int mbedtls_pem_read_buffer
              (mbedtls_pem_context *ctx,char *header,char *footer,uchar *data,uchar *pwd,
              size_t pwdlen,size_t *use_len)

{
  long lVar1;
  size_t pwdlen_00;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  size_t sVar5;
  uchar *dst;
  ulong uVar6;
  uint keylen;
  uchar *puVar7;
  long *plVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  size_t len;
  uchar pem_iv [16];
  size_t local_68;
  uchar *local_60;
  uchar local_58 [24];
  size_t local_40;
  uchar *local_38;
  
  if (ctx == (mbedtls_pem_context *)0x0) {
    return -0x1480;
  }
  local_40 = pwdlen;
  local_38 = pwd;
  puVar4 = (uchar *)strstr((char *)data,header);
  if (puVar4 == (uchar *)0x0) {
    return -0x1080;
  }
  local_60 = (uchar *)strstr((char *)data,footer);
  if (local_60 <= puVar4) {
    return -0x1080;
  }
  sVar5 = strlen(header);
  lVar1 = (puVar4[sVar5] == ' ') + sVar5;
  if (puVar4[(ulong)(puVar4[(puVar4[sVar5] == ' ') + sVar5] == '\r') + lVar1] != '\n') {
    return -0x1080;
  }
  puVar4 = puVar4 + (ulong)(puVar4[(puVar4[sVar5] == ' ') + sVar5] == '\r') + lVar1;
  sVar5 = strlen(footer);
  lVar1 = (local_60[sVar5] == ' ') + sVar5;
  *use_len = (size_t)(local_60 +
                     (((ulong)(local_60[(ulong)(local_60[(local_60[sVar5] == ' ') + sVar5] == '\r')
                                        + lVar1] == '\n') +
                      (ulong)(local_60[(local_60[sVar5] == ' ') + sVar5] == '\r') + lVar1) -
                     (long)data));
  auVar10[0] = -(puVar4[7] == 'y');
  auVar10[1] = -(puVar4[8] == 'p');
  auVar10[2] = -(puVar4[9] == 'e');
  auVar10[3] = -(puVar4[10] == ':');
  auVar10[4] = -(puVar4[0xb] == ' ');
  auVar10[5] = -(puVar4[0xc] == '4');
  auVar10[6] = -(puVar4[0xd] == ',');
  auVar10[7] = -(puVar4[0xe] == 'E');
  auVar10[8] = -(puVar4[0xf] == 'N');
  auVar10[9] = -(puVar4[0x10] == 'C');
  auVar10[10] = -(puVar4[0x11] == 'R');
  auVar10[0xb] = -(puVar4[0x12] == 'Y');
  auVar10[0xc] = -(puVar4[0x13] == 'P');
  auVar10[0xd] = -(puVar4[0x14] == 'T');
  auVar10[0xe] = -(puVar4[0x15] == 'E');
  auVar10[0xf] = -(puVar4[0x16] == 'D');
  auVar16[0] = -(puVar4[1] == 'P');
  auVar16[1] = -(puVar4[2] == 'r');
  auVar16[2] = -(puVar4[3] == 'o');
  auVar16[3] = -(puVar4[4] == 'c');
  auVar16[4] = -(puVar4[5] == '-');
  auVar16[5] = -(puVar4[6] == 'T');
  auVar16[6] = -(puVar4[7] == 'y');
  auVar16[7] = -(puVar4[8] == 'p');
  auVar16[8] = -(puVar4[9] == 'e');
  auVar16[9] = -(puVar4[10] == ':');
  auVar16[10] = -(puVar4[0xb] == ' ');
  auVar16[0xb] = -(puVar4[0xc] == '4');
  auVar16[0xc] = -(puVar4[0xd] == ',');
  auVar16[0xd] = -(puVar4[0xe] == 'E');
  auVar16[0xe] = -(puVar4[0xf] == 'N');
  auVar16[0xf] = -(puVar4[0x10] == 'C');
  auVar16 = auVar16 & auVar10;
  bVar9 = (ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff;
  if (bVar9) {
    puVar7 = puVar4 + 0x17;
    if (puVar4[0x17] == '\r') {
      puVar7 = puVar4 + 0x18;
    }
    if (puVar4[(ulong)(puVar4[0x17] == '\r') + 0x17] != '\n') {
      return -0x1100;
    }
    auVar17[0] = -(puVar7[8] == 'o');
    auVar17[1] = -(puVar7[9] == ':');
    auVar17[2] = -(puVar7[10] == ' ');
    auVar17[3] = -(puVar7[0xb] == 'D');
    auVar17[4] = -(puVar7[0xc] == 'E');
    auVar17[5] = -(puVar7[0xd] == 'S');
    auVar17[6] = -(puVar7[0xe] == '-');
    auVar17[7] = -(puVar7[0xf] == 'E');
    auVar17[8] = -(puVar7[0x10] == 'D');
    auVar17[9] = -(puVar7[0x11] == 'E');
    auVar17[10] = -(puVar7[0x12] == '3');
    auVar17[0xb] = -(puVar7[0x13] == '-');
    auVar17[0xc] = -(puVar7[0x14] == 'C');
    auVar17[0xd] = -(puVar7[0x15] == 'B');
    auVar17[0xe] = -(puVar7[0x16] == 'C');
    auVar17[0xf] = -(puVar7[0x17] == ',');
    auVar11[0] = -(puVar7[1] == 'D');
    auVar11[1] = -(puVar7[2] == 'E');
    auVar11[2] = -(puVar7[3] == 'K');
    auVar11[3] = -(puVar7[4] == '-');
    auVar11[4] = -(puVar7[5] == 'I');
    auVar11[5] = -(puVar7[6] == 'n');
    auVar11[6] = -(puVar7[7] == 'f');
    auVar11[7] = -(puVar7[8] == 'o');
    auVar11[8] = -(puVar7[9] == ':');
    auVar11[9] = -(puVar7[10] == ' ');
    auVar11[10] = -(puVar7[0xb] == 'D');
    auVar11[0xb] = -(puVar7[0xc] == 'E');
    auVar11[0xc] = -(puVar7[0xd] == 'S');
    auVar11[0xd] = -(puVar7[0xe] == '-');
    auVar11[0xe] = -(puVar7[0xf] == 'E');
    auVar11[0xf] = -(puVar7[0x10] == 'D');
    auVar11 = auVar11 & auVar17;
    if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff) {
      iVar2 = pem_get_iv(puVar7 + 0x18,local_58,8);
      if (iVar2 != 0) {
        return -0x1200;
      }
      plVar8 = (long *)(puVar7 + 0x28);
      iVar2 = 0x25;
    }
    else {
      plVar8 = (long *)(puVar7 + 1);
      auVar12[0] = -((char)*plVar8 == 'D');
      auVar12[1] = -(puVar7[2] == 'E');
      auVar12[2] = -(puVar7[3] == 'K');
      auVar12[3] = -(puVar7[4] == '-');
      auVar12[4] = -(puVar7[5] == 'I');
      auVar12[5] = -(puVar7[6] == 'n');
      auVar12[6] = -(puVar7[7] == 'f');
      auVar12[7] = -(puVar7[8] == 'o');
      auVar12[8] = -(puVar7[9] == ':');
      auVar12[9] = -(puVar7[10] == ' ');
      auVar12[10] = -(puVar7[0xb] == 'D');
      auVar12[0xb] = -(puVar7[0xc] == 'E');
      auVar12[0xc] = -(puVar7[0xd] == 'S');
      auVar12[0xd] = -(puVar7[0xe] == '-');
      auVar12[0xe] = -(puVar7[0xf] == 'C');
      auVar12[0xf] = -(puVar7[0x10] == 'B');
      auVar18[0] = -((char)*(undefined2 *)(puVar7 + 0x11) == 'C');
      auVar18[1] = -((char)((ushort)*(undefined2 *)(puVar7 + 0x11) >> 8) == ',');
      auVar18[2] = 0xff;
      auVar18[3] = 0xff;
      auVar18[4] = 0xff;
      auVar18[5] = 0xff;
      auVar18[6] = 0xff;
      auVar18[7] = 0xff;
      auVar18[8] = 0xff;
      auVar18[9] = 0xff;
      auVar18[10] = 0xff;
      auVar18[0xb] = 0xff;
      auVar18[0xc] = 0xff;
      auVar18[0xd] = 0xff;
      auVar18[0xe] = 0xff;
      auVar18[0xf] = 0xff;
      auVar18 = auVar18 & auVar12;
      iVar2 = 0;
      if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff) {
        iVar2 = pem_get_iv(puVar7 + 0x13,local_58,8);
        if (iVar2 != 0) {
          return -0x1200;
        }
        plVar8 = (long *)(puVar7 + 0x23);
        iVar2 = 0x21;
      }
    }
    if (*(long *)((long)plVar8 + 6) == 0x2d534541203a6f66 && *plVar8 == 0x6f666e492d4b4544) {
      auVar19[0] = -(*(char *)((long)plVar8 + 6) == 'f');
      auVar19[1] = -(*(char *)((long)plVar8 + 7) == 'o');
      auVar19[2] = -((char)plVar8[1] == ':');
      auVar19[3] = -(*(char *)((long)plVar8 + 9) == ' ');
      auVar19[4] = -(*(char *)((long)plVar8 + 10) == 'A');
      auVar19[5] = -(*(char *)((long)plVar8 + 0xb) == 'E');
      auVar19[6] = -(*(char *)((long)plVar8 + 0xc) == 'S');
      auVar19[7] = -(*(char *)((long)plVar8 + 0xd) == '-');
      auVar19[8] = -(*(char *)((long)plVar8 + 0xe) == '1');
      auVar19[9] = -(*(char *)((long)plVar8 + 0xf) == '2');
      auVar19[10] = -((char)plVar8[2] == '8');
      auVar19[0xb] = -(*(char *)((long)plVar8 + 0x11) == '-');
      auVar19[0xc] = -(*(char *)((long)plVar8 + 0x12) == 'C');
      auVar19[0xd] = -(*(char *)((long)plVar8 + 0x13) == 'B');
      auVar19[0xe] = -(*(char *)((long)plVar8 + 0x14) == 'C');
      auVar19[0xf] = -(*(char *)((long)plVar8 + 0x15) == ',');
      auVar13[0] = -((char)*plVar8 == 'D');
      auVar13[1] = -(*(char *)((long)plVar8 + 1) == 'E');
      auVar13[2] = -(*(char *)((long)plVar8 + 2) == 'K');
      auVar13[3] = -(*(char *)((long)plVar8 + 3) == '-');
      auVar13[4] = -(*(char *)((long)plVar8 + 4) == 'I');
      auVar13[5] = -(*(char *)((long)plVar8 + 5) == 'n');
      auVar13[6] = -(*(char *)((long)plVar8 + 6) == 'f');
      auVar13[7] = -(*(char *)((long)plVar8 + 7) == 'o');
      auVar13[8] = -((char)plVar8[1] == ':');
      auVar13[9] = -(*(char *)((long)plVar8 + 9) == ' ');
      auVar13[10] = -(*(char *)((long)plVar8 + 10) == 'A');
      auVar13[0xb] = -(*(char *)((long)plVar8 + 0xb) == 'E');
      auVar13[0xc] = -(*(char *)((long)plVar8 + 0xc) == 'S');
      auVar13[0xd] = -(*(char *)((long)plVar8 + 0xd) == '-');
      auVar13[0xe] = -(*(char *)((long)plVar8 + 0xe) == '1');
      auVar13[0xf] = -(*(char *)((long)plVar8 + 0xf) == '2');
      auVar13 = auVar13 & auVar19;
      if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff) {
        iVar2 = 5;
      }
      else {
        auVar20[0] = -(*(char *)((long)plVar8 + 6) == 'f');
        auVar20[1] = -(*(char *)((long)plVar8 + 7) == 'o');
        auVar20[2] = -((char)plVar8[1] == ':');
        auVar20[3] = -(*(char *)((long)plVar8 + 9) == ' ');
        auVar20[4] = -(*(char *)((long)plVar8 + 10) == 'A');
        auVar20[5] = -(*(char *)((long)plVar8 + 0xb) == 'E');
        auVar20[6] = -(*(char *)((long)plVar8 + 0xc) == 'S');
        auVar20[7] = -(*(char *)((long)plVar8 + 0xd) == '-');
        auVar20[8] = -(*(char *)((long)plVar8 + 0xe) == '1');
        auVar20[9] = -(*(char *)((long)plVar8 + 0xf) == '9');
        auVar20[10] = -((char)plVar8[2] == '2');
        auVar20[0xb] = -(*(char *)((long)plVar8 + 0x11) == '-');
        auVar20[0xc] = -(*(char *)((long)plVar8 + 0x12) == 'C');
        auVar20[0xd] = -(*(char *)((long)plVar8 + 0x13) == 'B');
        auVar20[0xe] = -(*(char *)((long)plVar8 + 0x14) == 'C');
        auVar20[0xf] = -(*(char *)((long)plVar8 + 0x15) == ',');
        auVar14[0] = -((char)*plVar8 == 'D');
        auVar14[1] = -(*(char *)((long)plVar8 + 1) == 'E');
        auVar14[2] = -(*(char *)((long)plVar8 + 2) == 'K');
        auVar14[3] = -(*(char *)((long)plVar8 + 3) == '-');
        auVar14[4] = -(*(char *)((long)plVar8 + 4) == 'I');
        auVar14[5] = -(*(char *)((long)plVar8 + 5) == 'n');
        auVar14[6] = -(*(char *)((long)plVar8 + 6) == 'f');
        auVar14[7] = -(*(char *)((long)plVar8 + 7) == 'o');
        auVar14[8] = -((char)plVar8[1] == ':');
        auVar14[9] = -(*(char *)((long)plVar8 + 9) == ' ');
        auVar14[10] = -(*(char *)((long)plVar8 + 10) == 'A');
        auVar14[0xb] = -(*(char *)((long)plVar8 + 0xb) == 'E');
        auVar14[0xc] = -(*(char *)((long)plVar8 + 0xc) == 'S');
        auVar14[0xd] = -(*(char *)((long)plVar8 + 0xd) == '-');
        auVar14[0xe] = -(*(char *)((long)plVar8 + 0xe) == '1');
        auVar14[0xf] = -(*(char *)((long)plVar8 + 0xf) == '9');
        auVar14 = auVar14 & auVar20;
        if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff) {
          iVar2 = 6;
        }
        else {
          auVar21[0] = -(*(char *)((long)plVar8 + 6) == 'f');
          auVar21[1] = -(*(char *)((long)plVar8 + 7) == 'o');
          auVar21[2] = -((char)plVar8[1] == ':');
          auVar21[3] = -(*(char *)((long)plVar8 + 9) == ' ');
          auVar21[4] = -(*(char *)((long)plVar8 + 10) == 'A');
          auVar21[5] = -(*(char *)((long)plVar8 + 0xb) == 'E');
          auVar21[6] = -(*(char *)((long)plVar8 + 0xc) == 'S');
          auVar21[7] = -(*(char *)((long)plVar8 + 0xd) == '-');
          auVar21[8] = -(*(char *)((long)plVar8 + 0xe) == '2');
          auVar21[9] = -(*(char *)((long)plVar8 + 0xf) == '5');
          auVar21[10] = -((char)plVar8[2] == '6');
          auVar21[0xb] = -(*(char *)((long)plVar8 + 0x11) == '-');
          auVar21[0xc] = -(*(char *)((long)plVar8 + 0x12) == 'C');
          auVar21[0xd] = -(*(char *)((long)plVar8 + 0x13) == 'B');
          auVar21[0xe] = -(*(char *)((long)plVar8 + 0x14) == 'C');
          auVar21[0xf] = -(*(char *)((long)plVar8 + 0x15) == ',');
          auVar15[0] = -((char)*plVar8 == 'D');
          auVar15[1] = -(*(char *)((long)plVar8 + 1) == 'E');
          auVar15[2] = -(*(char *)((long)plVar8 + 2) == 'K');
          auVar15[3] = -(*(char *)((long)plVar8 + 3) == '-');
          auVar15[4] = -(*(char *)((long)plVar8 + 4) == 'I');
          auVar15[5] = -(*(char *)((long)plVar8 + 5) == 'n');
          auVar15[6] = -(*(char *)((long)plVar8 + 6) == 'f');
          auVar15[7] = -(*(char *)((long)plVar8 + 7) == 'o');
          auVar15[8] = -((char)plVar8[1] == ':');
          auVar15[9] = -(*(char *)((long)plVar8 + 9) == ' ');
          auVar15[10] = -(*(char *)((long)plVar8 + 10) == 'A');
          auVar15[0xb] = -(*(char *)((long)plVar8 + 0xb) == 'E');
          auVar15[0xc] = -(*(char *)((long)plVar8 + 0xc) == 'S');
          auVar15[0xd] = -(*(char *)((long)plVar8 + 0xd) == '-');
          auVar15[0xe] = -(*(char *)((long)plVar8 + 0xe) == '2');
          auVar15[0xf] = -(*(char *)((long)plVar8 + 0xf) == '5');
          auVar15 = auVar15 & auVar21;
          if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) != 0xffff) {
            return -0x1280;
          }
          iVar2 = 7;
        }
      }
      iVar3 = pem_get_iv((uchar *)((long)plVar8 + 0x16),local_58,0x10);
      if (iVar3 != 0) {
        return -0x1200;
      }
      plVar8 = (long *)((long)plVar8 + 0x36);
    }
    if (iVar2 == 0) {
      return -0x1280;
    }
    uVar6 = (ulong)((char)*plVar8 == '\r');
    if (*(char *)((long)plVar8 + uVar6) != '\n') {
      return -0x1100;
    }
    puVar4 = (uchar *)((long)plVar8 + uVar6);
  }
  else {
    iVar2 = 0;
  }
  puVar7 = local_60;
  puVar4 = puVar4 + 1;
  if (puVar4 == local_60) {
    return -0x1100;
  }
  local_60 = (uchar *)CONCAT44(local_60._4_4_,iVar2);
  iVar2 = mbedtls_base64_decode((uchar *)0x0,0,&local_68,puVar4,(long)puVar7 - (long)puVar4);
  sVar5 = local_68;
  if (iVar2 == -0x2c) {
    return -0x112c;
  }
  dst = (uchar *)calloc(1,local_68);
  if (dst == (uchar *)0x0) {
    return -0x1180;
  }
  iVar2 = mbedtls_base64_decode(dst,sVar5,&local_68,puVar4,(long)puVar7 - (long)puVar4);
  puVar4 = local_38;
  pwdlen_00 = local_40;
  if (iVar2 != 0) {
    free(dst);
    return iVar2 + -0x1100;
  }
  if (!bVar9) goto LAB_001eac7c;
  if (local_38 == (uchar *)0x0) {
    free(dst);
    return -0x1300;
  }
  iVar2 = (int)local_60;
  if ((int)local_60 < 7) {
    if ((int)local_60 == 5) {
LAB_001eae12:
      keylen = 0x10;
      goto LAB_001eae40;
    }
    if ((int)local_60 == 6) {
LAB_001eae32:
      keylen = 0x18;
      goto LAB_001eae40;
    }
  }
  else {
    if ((int)local_60 != 7) {
      if ((int)local_60 == 0x21) {
        pem_des_decrypt(local_58,dst,local_68,local_38,local_40);
      }
      else {
        if ((int)local_60 != 0x25) goto LAB_001eae54;
        pem_des3_decrypt(local_58,dst,local_68,local_38,local_40);
      }
      if (iVar2 != 7) {
        if (iVar2 == 6) goto LAB_001eae32;
        if (iVar2 != 5) goto LAB_001eae54;
        goto LAB_001eae12;
      }
    }
    keylen = 0x20;
LAB_001eae40:
    pem_aes_decrypt(local_58,keylen,dst,local_68,puVar4,pwdlen_00);
  }
LAB_001eae54:
  if (((local_68 < 3) || (*dst != '0')) || (0x83 < dst[1])) {
    free(dst);
    return -0x1380;
  }
LAB_001eac7c:
  ctx->buf = dst;
  ctx->buflen = local_68;
  return 0;
}

Assistant:

int mbedtls_pem_read_buffer( mbedtls_pem_context *ctx, const char *header, const char *footer,
                     const unsigned char *data, const unsigned char *pwd,
                     size_t pwdlen, size_t *use_len )
{
    int ret, enc;
    size_t len;
    unsigned char *buf;
    const unsigned char *s1, *s2, *end;
#if defined(MBEDTLS_MD5_C) && defined(MBEDTLS_CIPHER_MODE_CBC) &&         \
    ( defined(MBEDTLS_DES_C) || defined(MBEDTLS_AES_C) )
    unsigned char pem_iv[16];
    mbedtls_cipher_type_t enc_alg = MBEDTLS_CIPHER_NONE;
#else
    ((void) pwd);
    ((void) pwdlen);
#endif /* MBEDTLS_MD5_C && MBEDTLS_CIPHER_MODE_CBC &&
          ( MBEDTLS_AES_C || MBEDTLS_DES_C ) */

    if( ctx == NULL )
        return( MBEDTLS_ERR_PEM_BAD_INPUT_DATA );

    s1 = (unsigned char *) strstr( (const char *) data, header );

    if( s1 == NULL )
        return( MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT );

    s2 = (unsigned char *) strstr( (const char *) data, footer );

    if( s2 == NULL || s2 <= s1 )
        return( MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT );

    s1 += strlen( header );
    if( *s1 == ' '  ) s1++;
    if( *s1 == '\r' ) s1++;
    if( *s1 == '\n' ) s1++;
    else return( MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT );

    end = s2;
    end += strlen( footer );
    if( *end == ' '  ) end++;
    if( *end == '\r' ) end++;
    if( *end == '\n' ) end++;
    *use_len = end - data;

    enc = 0;

    if( memcmp( s1, "Proc-Type: 4,ENCRYPTED", 22 ) == 0 )
    {
#if defined(MBEDTLS_MD5_C) && defined(MBEDTLS_CIPHER_MODE_CBC) &&         \
    ( defined(MBEDTLS_DES_C) || defined(MBEDTLS_AES_C) )
        enc++;

        s1 += 22;
        if( *s1 == '\r' ) s1++;
        if( *s1 == '\n' ) s1++;
        else return( MBEDTLS_ERR_PEM_INVALID_DATA );


#if defined(MBEDTLS_DES_C)
        if( memcmp( s1, "DEK-Info: DES-EDE3-CBC,", 23 ) == 0 )
        {
            enc_alg = MBEDTLS_CIPHER_DES_EDE3_CBC;

            s1 += 23;
            if( pem_get_iv( s1, pem_iv, 8 ) != 0 )
                return( MBEDTLS_ERR_PEM_INVALID_ENC_IV );

            s1 += 16;
        }
        else if( memcmp( s1, "DEK-Info: DES-CBC,", 18 ) == 0 )
        {
            enc_alg = MBEDTLS_CIPHER_DES_CBC;

            s1 += 18;
            if( pem_get_iv( s1, pem_iv, 8) != 0 )
                return( MBEDTLS_ERR_PEM_INVALID_ENC_IV );

            s1 += 16;
        }
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_AES_C)
        if( memcmp( s1, "DEK-Info: AES-", 14 ) == 0 )
        {
            if( memcmp( s1, "DEK-Info: AES-128-CBC,", 22 ) == 0 )
                enc_alg = MBEDTLS_CIPHER_AES_128_CBC;
            else if( memcmp( s1, "DEK-Info: AES-192-CBC,", 22 ) == 0 )
                enc_alg = MBEDTLS_CIPHER_AES_192_CBC;
            else if( memcmp( s1, "DEK-Info: AES-256-CBC,", 22 ) == 0 )
                enc_alg = MBEDTLS_CIPHER_AES_256_CBC;
            else
                return( MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG );

            s1 += 22;
            if( pem_get_iv( s1, pem_iv, 16 ) != 0 )
                return( MBEDTLS_ERR_PEM_INVALID_ENC_IV );

            s1 += 32;
        }
#endif /* MBEDTLS_AES_C */

        if( enc_alg == MBEDTLS_CIPHER_NONE )
            return( MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG );

        if( *s1 == '\r' ) s1++;
        if( *s1 == '\n' ) s1++;
        else return( MBEDTLS_ERR_PEM_INVALID_DATA );
#else
        return( MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE );
#endif /* MBEDTLS_MD5_C && MBEDTLS_CIPHER_MODE_CBC &&
          ( MBEDTLS_AES_C || MBEDTLS_DES_C ) */
    }

    if( s1 == s2 )
        return( MBEDTLS_ERR_PEM_INVALID_DATA );

    ret = mbedtls_base64_decode( NULL, 0, &len, s1, s2 - s1 );

    if( ret == MBEDTLS_ERR_BASE64_INVALID_CHARACTER )
        return( MBEDTLS_ERR_PEM_INVALID_DATA + ret );

    if( ( buf = mbedtls_calloc( 1, len ) ) == NULL )
        return( MBEDTLS_ERR_PEM_ALLOC_FAILED );

    if( ( ret = mbedtls_base64_decode( buf, len, &len, s1, s2 - s1 ) ) != 0 )
    {
        mbedtls_free( buf );
        return( MBEDTLS_ERR_PEM_INVALID_DATA + ret );
    }

    if( enc != 0 )
    {
#if defined(MBEDTLS_MD5_C) && defined(MBEDTLS_CIPHER_MODE_CBC) &&         \
    ( defined(MBEDTLS_DES_C) || defined(MBEDTLS_AES_C) )
        if( pwd == NULL )
        {
            mbedtls_free( buf );
            return( MBEDTLS_ERR_PEM_PASSWORD_REQUIRED );
        }

#if defined(MBEDTLS_DES_C)
        if( enc_alg == MBEDTLS_CIPHER_DES_EDE3_CBC )
            pem_des3_decrypt( pem_iv, buf, len, pwd, pwdlen );
        else if( enc_alg == MBEDTLS_CIPHER_DES_CBC )
            pem_des_decrypt( pem_iv, buf, len, pwd, pwdlen );
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_AES_C)
        if( enc_alg == MBEDTLS_CIPHER_AES_128_CBC )
            pem_aes_decrypt( pem_iv, 16, buf, len, pwd, pwdlen );
        else if( enc_alg == MBEDTLS_CIPHER_AES_192_CBC )
            pem_aes_decrypt( pem_iv, 24, buf, len, pwd, pwdlen );
        else if( enc_alg == MBEDTLS_CIPHER_AES_256_CBC )
            pem_aes_decrypt( pem_iv, 32, buf, len, pwd, pwdlen );
#endif /* MBEDTLS_AES_C */

        /*
         * The result will be ASN.1 starting with a SEQUENCE tag, with 1 to 3
         * length bytes (allow 4 to be sure) in all known use cases.
         *
         * Use that as heurisitic to try detecting password mismatchs.
         */
        if( len <= 2 || buf[0] != 0x30 || buf[1] > 0x83 )
        {
            mbedtls_free( buf );
            return( MBEDTLS_ERR_PEM_PASSWORD_MISMATCH );
        }
#else
        mbedtls_free( buf );
        return( MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE );
#endif /* MBEDTLS_MD5_C && MBEDTLS_CIPHER_MODE_CBC &&
          ( MBEDTLS_AES_C || MBEDTLS_DES_C ) */
    }

    ctx->buf = buf;
    ctx->buflen = len;

    return( 0 );
}